

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

uint32_t LinearToGammaS(uint32_t value)

{
  uint uVar1;
  uint32_t result;
  uint32_t v2;
  uint32_t v1;
  uint32_t v0;
  uint32_t x;
  uint32_t tab_pos;
  uint32_t v;
  uint32_t value_local;
  
  uVar1 = value * 0x20 >> 0xe;
  return kLinearToGammaTabS[uVar1] +
         ((kLinearToGammaTabS[uVar1 + 1] - kLinearToGammaTabS[uVar1]) *
          (value * 0x20 + uVar1 * -0x4000) >> 0xe);
}

Assistant:

static WEBP_INLINE uint32_t LinearToGammaS(uint32_t value) {
  // 'value' is in GAMMA_TO_LINEAR_BITS fractional precision
  const uint32_t v = value * kGammaTabSize;
  const uint32_t tab_pos = v >> GAMMA_TO_LINEAR_BITS;
  // fractional part, in GAMMA_TO_LINEAR_BITS fixed-point precision
  const uint32_t x = v - (tab_pos << GAMMA_TO_LINEAR_BITS);  // fractional part
  // v0 / v1 are in GAMMA_TO_LINEAR_BITS fixed-point precision (range [0..1])
  const uint32_t v0 = kLinearToGammaTabS[tab_pos + 0];
  const uint32_t v1 = kLinearToGammaTabS[tab_pos + 1];
  // Final interpolation. Note that rounding is already included.
  const uint32_t v2 = (v1 - v0) * x;    // note: v1 >= v0.
  const uint32_t result = v0 + (v2 >> GAMMA_TO_LINEAR_BITS);
  return result;
}